

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastDivider2(Gia_Man_t *pNew,int *pNum,int nNum,int *pDiv,int nDiv,int fQuo,
                      Vec_Int_t *vRes)

{
  int b;
  int c;
  Vec_Int_t *p;
  int *piVar1;
  Gia_Man_t *pNew_00;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  undefined4 in_register_00000014;
  int *ps;
  ulong uVar5;
  int *__ptr;
  ulong uVar6;
  int Carry_1;
  int Carry;
  int Temp;
  int local_a8;
  int local_a4;
  int *local_a0;
  ulong local_98;
  int local_8c;
  int local_88;
  int local_84;
  Vec_Int_t *local_80;
  int *local_78;
  int *local_70;
  Gia_Man_t *local_68;
  ulong local_60;
  int *local_58;
  ulong local_50;
  int *local_48;
  ulong local_40;
  ulong local_38;
  
  local_98 = CONCAT44(in_register_00000014,nNum);
  uVar5 = (ulong)(uint)nDiv;
  local_a0 = vRes->pArray;
  local_8c = fQuo;
  local_70 = pDiv;
  local_78 = (int *)malloc((long)nNum * 4);
  if ((nNum < 1) || (nDiv < 1)) {
    __assert_fail("nNum > 0 && nDiv > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                  ,0x275,
                  "void Wlc_BlastDivider2(Gia_Man_t *, int *, int, int *, int, int, Vec_Int_t *)");
  }
  uVar2 = (int)local_98 + nDiv;
  if ((int)uVar2 <= vRes->nSize) {
    __assert_fail("Vec_IntSize(vRes) < nNum + nDiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                  ,0x276,
                  "void Wlc_BlastDivider2(Gia_Man_t *, int *, int, int *, int, int, Vec_Int_t *)");
  }
  uVar4 = 0;
  do {
    iVar3 = 0;
    if ((long)uVar4 < (long)nNum) {
      iVar3 = pNum[uVar4];
    }
    local_a0[uVar4] = iVar3;
    uVar4 = uVar4 + 1;
  } while (uVar2 != uVar4);
  local_80 = vRes;
  uVar4 = (ulong)((int)local_98 - 1);
  local_38 = (ulong)(nDiv + 1);
  local_58 = local_a0 + uVar5;
  ps = local_a0 + uVar4;
  local_68 = pNew;
  local_60 = uVar5;
  local_50 = uVar4;
  while( true ) {
    local_a4 = 1;
    if (uVar4 != local_50) {
      local_a4 = local_78[uVar4 + 1];
    }
    uVar6 = 0;
    local_88 = local_a4;
    local_48 = ps;
    local_40 = uVar4;
    do {
      c = local_a4;
      iVar3 = 0;
      if (uVar6 < uVar5) {
        iVar3 = local_70[uVar6];
      }
      b = *ps;
      iVar3 = Gia_ManHashXor(pNew,iVar3,local_88);
      Wlc_BlastFullAdder(pNew,iVar3,b,c,&local_a4,ps);
      pNew_00 = local_68;
      piVar1 = local_70;
      __ptr = local_78;
      p = local_80;
      uVar6 = uVar6 + 1;
      ps = ps + 1;
    } while (local_38 != uVar6);
    if (local_58[local_40] < 0) break;
    local_78[local_40] = local_58[local_40] ^ 1;
    uVar4 = local_40 - 1;
    ps = local_48 + -1;
    if ((int)local_40 < 1) {
      if (local_8c == 0) {
        local_a8 = 0;
        uVar4 = 0;
        do {
          Wlc_BlastFullAdder(pNew_00,piVar1[uVar4],local_a0[uVar4],local_a8,&local_a8,&local_84);
          iVar3 = Gia_ManHashMux(pNew_00,*__ptr,local_a0[uVar4],local_84);
          local_a0[uVar4] = iVar3;
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
        if (local_80->nSize < (int)local_60) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        local_80->nSize = (int)local_60;
        __ptr = local_78;
      }
      else {
        local_80->nSize = 0;
        uVar5 = local_98 & 0xffffffff;
        uVar4 = 0;
        do {
          Vec_IntPush(p,__ptr[uVar4]);
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
      }
      free(__ptr);
      return;
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x131,"int Abc_LitNot(int)");
}

Assistant:

void Wlc_BlastDivider2( Gia_Man_t * pNew, int * pNum, int nNum, int * pDiv, int nDiv, int fQuo, Vec_Int_t * vRes )
{
    int i, * pRes  = Vec_IntArray(vRes);
    int k, * pQuo  = ABC_ALLOC( int, nNum );
    assert( nNum > 0 && nDiv > 0 );
    assert( Vec_IntSize(vRes) < nNum + nDiv );
    for ( i = 0; i < nNum + nDiv; i++ )
        pRes[i] = i < nNum ? pNum[i] : 0;
    for ( i = nNum-1; i >= 0; i-- )
    {
        int Cntrl = i == nNum-1 ? 1 : pQuo[i+1];
        int Carry = Cntrl;
        for ( k = 0; k <= nDiv; k++ )
            Wlc_BlastFullAdderSubtr( pNew, k < nDiv ? pDiv[k] : 0, pRes[i+k], Carry, &Carry, &pRes[i+k], Cntrl );
        pQuo[i] = Abc_LitNot(pRes[i+nDiv]);
    }
    if ( fQuo )
        Wlc_VecCopy( vRes, pQuo, nNum );
    else
    {
        int Carry = 0, Temp;
        for ( k = 0; k < nDiv; k++ )
        {
            Wlc_BlastFullAdder( pNew, pDiv[k], pRes[k], Carry, &Carry, &Temp );
            pRes[k] = Gia_ManHashMux( pNew, pQuo[0], pRes[k], Temp );
        }
        Vec_IntShrink( vRes, nDiv );
    }
    ABC_FREE( pQuo );
}